

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O0

bool __thiscall AGSSock::Pool::operator_cast_to_bool(Pool *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppSVar3;
  Socket *sock;
  iterator __end1;
  iterator __begin1;
  Sockets *__range1;
  Lock local_20;
  Lock lock;
  Pool *this_local;
  
  lock.mutex_ = (Mutex *)this;
  AGSSockAPI::Mutex::Lock::Lock(&local_20,&this->guard_);
  sVar2 = std::
          unordered_set<AGSSock::Socket_*,_std::hash<AGSSock::Socket_*>,_std::equal_to<AGSSock::Socket_*>,_std::allocator<AGSSock::Socket_*>_>
          ::size(&this->sockets_);
  if (sVar2 != 0) {
    bVar1 = AGSSockAPI::Thread::active(&this->thread_);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_00109968;
    }
  }
  __end1 = std::
           unordered_set<AGSSock::Socket_*,_std::hash<AGSSock::Socket_*>,_std::equal_to<AGSSock::Socket_*>,_std::allocator<AGSSock::Socket_*>_>
           ::begin(&this->sockets_);
  sock = (Socket *)
         std::
         unordered_set<AGSSock::Socket_*,_std::hash<AGSSock::Socket_*>,_std::equal_to<AGSSock::Socket_*>,_std::allocator<AGSSock::Socket_*>_>
         ::end(&this->sockets_);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.super__Node_iterator_base<AGSSock::Socket_*,_false>,
                       (_Node_iterator_base<AGSSock::Socket_*,_false> *)&sock);
    if (!bVar1) break;
    ppSVar3 = std::__detail::_Node_iterator<AGSSock::Socket_*,_true,_false>::operator*(&__end1);
    if ((*ppSVar3)->id == -1) {
      this_local._7_1_ = false;
      goto LAB_00109968;
    }
    std::__detail::_Node_iterator<AGSSock::Socket_*,_true,_false>::operator++(&__end1);
  }
  this_local._7_1_ = true;
LAB_00109968:
  AGSSockAPI::Mutex::Lock::~Lock(&local_20);
  return this_local._7_1_;
}

Assistant:

Pool::operator bool()
{
	Mutex::Lock lock(guard_);

	if ((sockets_.size() > 0) && !thread_.active())
		return false;

	for (Socket *sock : sockets_)
		if (sock->id == INVALID_SOCKET)
			return false;

	return true;
}